

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spgmr_serial.c
# Opt level: O1

int PSolve(void *Data,N_Vector r_vec,N_Vector z_vec,sunrealtype tol,int lr)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  lVar2 = N_VGetArrayPointer(r_vec);
  if (((lVar2 == 0) || (lVar3 = N_VGetArrayPointer(z_vec), lVar3 == 0)) ||
     (lVar4 = N_VGetArrayPointer(*(undefined8 *)((long)Data + 8)), lVar4 == 0)) {
    PSolve_cold_1();
    iVar5 = 1;
  }
  else {
    lVar1 = *Data;
    iVar5 = 0;
    if (0 < lVar1) {
      lVar6 = 0;
      do {
        *(double *)(lVar3 + lVar6 * 8) =
             *(double *)(lVar2 + lVar6 * 8) / *(double *)(lVar4 + lVar6 * 8);
        lVar6 = lVar6 + 1;
        iVar5 = 0;
      } while (lVar1 != lVar6);
    }
  }
  return iVar5;
}

Assistant:

int PSolve(void* Data, N_Vector r_vec, N_Vector z_vec, sunrealtype tol, int lr)
{
  /* local variables */
  sunrealtype *r, *z, *d;
  sunindextype i;
  UserData* ProbData;

  /* access user data structure and vector data */
  ProbData = (UserData*)Data;
  r        = N_VGetArrayPointer(r_vec);
  if (check_flag(r, "N_VGetArrayPointer", 0)) { return 1; }
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) { return 1; }
  d = N_VGetArrayPointer(ProbData->d);
  if (check_flag(d, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate through domain, performing Jacobi solve */
  for (i = 0; i < ProbData->N; i++) { z[i] = r[i] / d[i]; }

  /* return with success */
  return 0;
}